

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stralloc_catb.c
# Opt level: O0

int stralloc_catb(stralloc *sa,char *s,uint n)

{
  int iVar1;
  uint n_local;
  char *s_local;
  stralloc *sa_local;
  
  if (sa->s == (char *)0x0) {
    sa_local._4_4_ = stralloc_copyb(sa,s,n);
  }
  else {
    iVar1 = stralloc_readyplus(sa,n + 1);
    if (iVar1 == 0) {
      sa_local._4_4_ = 0;
    }
    else {
      byte_copy(sa->s + sa->len,n,s);
      sa->len = n + sa->len;
      sa->s[sa->len] = 'Z';
      sa_local._4_4_ = 1;
    }
  }
  return sa_local._4_4_;
}

Assistant:

int stralloc_catb(stralloc *sa,const char *s,unsigned int n)
{
  if (!sa->s) return stralloc_copyb(sa,s,n);
  if (!stralloc_readyplus(sa,n + 1)) return 0;
  byte_copy(sa->s + sa->len,n,s);
  sa->len += n;
  sa->s[sa->len] = 'Z'; /* ``offensive programming'' */
  return 1;
}